

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v5::internal::container_buffer<fmt::v5::internal::basic_buffer<char>_>::grow
          (container_buffer<fmt::v5::internal::basic_buffer<char>_> *this,size_t capacity)

{
  char *buf_data;
  size_t capacity_local;
  container_buffer<fmt::v5::internal::basic_buffer<char>_> *this_local;
  
  basic_buffer<char>::resize(this->container_,capacity);
  buf_data = basic_buffer<char>::operator[](this->container_,0);
  basic_buffer<char>::set(&this->super_basic_buffer<char>,buf_data,capacity);
  return;
}

Assistant:

void grow(std::size_t capacity) FMT_OVERRIDE {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }